

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O1

void Assimp::SceneCombiner::MergeBones(aiMesh *out,const_iterator it,const_iterator end)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  _List_node_base *p_Var7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  _List_node_base **pp_Var13;
  aiMesh *paVar14;
  aiBone **ppaVar15;
  aiBone *paVar16;
  Logger *this;
  aiVertexWeight *__s;
  aiVertexWeight *paVar17;
  const_iterator boneEnd;
  ulong uVar18;
  _List_node_base *p_Var19;
  _List_node_base *p_Var20;
  list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> asBones;
  _List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> local_458;
  aiMesh *local_440;
  uint uStack_434;
  undefined1 local_430 [1024];
  
  local_458._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_458;
  local_458._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_458;
  if ((out != (aiMesh *)0x0) && (out->mNumBones != 0)) {
    local_458._M_impl._M_node._M_size = 0;
    BuildUniqueBoneList((list<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_> *)
                        &local_458,it,end);
    out->mNumBones = 0;
    ppaVar15 = (aiBone **)
               operator_new__(-(ulong)(local_458._M_impl._M_node._M_size >> 0x3d != 0) |
                              local_458._M_impl._M_node._M_size << 3);
    out->mBones = ppaVar15;
    p_Var20 = local_458._M_impl._M_node.super__List_node_base._M_next;
    paVar14 = out;
    if (local_458._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_458) {
      do {
        local_440 = paVar14;
        paVar14 = local_440;
        paVar16 = (aiBone *)operator_new(0x460);
        (paVar16->mName).length = 0;
        (paVar16->mName).data[0] = '\0';
        memset((paVar16->mName).data + 1,0x1b,0x3ff);
        paVar16->mNumWeights = 0;
        paVar16->mWeights = (aiVertexWeight *)0x0;
        (paVar16->mOffsetMatrix).a1 = 1.0;
        (paVar16->mOffsetMatrix).a2 = 0.0;
        (paVar16->mOffsetMatrix).a3 = 0.0;
        (paVar16->mOffsetMatrix).a4 = 0.0;
        (paVar16->mOffsetMatrix).b1 = 0.0;
        (paVar16->mOffsetMatrix).b2 = 1.0;
        (paVar16->mOffsetMatrix).b3 = 0.0;
        (paVar16->mOffsetMatrix).b4 = 0.0;
        (paVar16->mOffsetMatrix).c1 = 0.0;
        (paVar16->mOffsetMatrix).c2 = 0.0;
        (paVar16->mOffsetMatrix).c3 = 1.0;
        (paVar16->mOffsetMatrix).c4 = 0.0;
        (paVar16->mOffsetMatrix).d1 = 0.0;
        (paVar16->mOffsetMatrix).d2 = 0.0;
        (paVar16->mOffsetMatrix).d3 = 0.0;
        (paVar16->mOffsetMatrix).d4 = 1.0;
        uVar3 = paVar14->mNumBones;
        paVar14->mNumBones = uVar3 + 1;
        paVar14->mBones[uVar3] = paVar16;
        uVar3 = *(uint *)&(p_Var20[1]._M_prev)->_M_next;
        if (0x3fe < uVar3) {
          uVar3 = 0x3ff;
        }
        uVar18 = (ulong)uVar3;
        uStack_434 = uVar3;
        memcpy(local_430,(void *)((long)&(p_Var20[1]._M_prev)->_M_next + 4),uVar18);
        local_430[uVar18] = 0;
        (paVar16->mName).length = uVar3;
        memcpy((paVar16->mName).data,local_430,uVar18);
        (paVar16->mName).data[uVar18] = '\0';
        p_Var19 = p_Var20[2]._M_next;
        p_Var4 = p_Var20[2]._M_prev;
        if (p_Var19 != p_Var4) {
          do {
            paVar16->mNumWeights =
                 paVar16->mNumWeights + *(int *)((long)&p_Var19->_M_next[0x40]._M_next + 4);
            if (p_Var19 == p_Var20[2]._M_next) {
LAB_003cf3b3:
              p_Var5 = p_Var19->_M_next;
              p_Var6 = p_Var5[0x42]._M_next;
              p_Var7 = p_Var5[0x42]._M_prev;
              p_Var8 = p_Var5[0x43]._M_next;
              p_Var9 = p_Var5[0x43]._M_prev;
              p_Var10 = p_Var5[0x44]._M_next;
              p_Var11 = p_Var5[0x44]._M_prev;
              p_Var12 = p_Var5[0x45]._M_prev;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).d1 = p_Var5[0x45]._M_next;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).d3 = p_Var12;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).c1 = p_Var10;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).c3 = p_Var11;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).b1 = p_Var8;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).b3 = p_Var9;
              *(_List_node_base **)&paVar16->mOffsetMatrix = p_Var6;
              *(_List_node_base **)&(paVar16->mOffsetMatrix).a3 = p_Var7;
            }
            else {
              p_Var5 = p_Var19->_M_next;
              fVar2 = (paVar16->mOffsetMatrix).a1;
              if ((fVar2 == *(float *)&p_Var5[0x42]._M_next) &&
                 (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x42]._M_next))) {
                fVar2 = (paVar16->mOffsetMatrix).a2;
                pfVar1 = (float *)((long)&p_Var5[0x42]._M_next + 4);
                if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                  fVar2 = (paVar16->mOffsetMatrix).a3;
                  if ((fVar2 == *(float *)&p_Var5[0x42]._M_prev) &&
                     (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x42]._M_prev))) {
                    fVar2 = (paVar16->mOffsetMatrix).a4;
                    pfVar1 = (float *)((long)&p_Var5[0x42]._M_prev + 4);
                    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                      fVar2 = (paVar16->mOffsetMatrix).b1;
                      if ((fVar2 == *(float *)&p_Var5[0x43]._M_next) &&
                         (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x43]._M_next))) {
                        fVar2 = (paVar16->mOffsetMatrix).b2;
                        pfVar1 = (float *)((long)&p_Var5[0x43]._M_next + 4);
                        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                          fVar2 = (paVar16->mOffsetMatrix).b3;
                          if ((fVar2 == *(float *)&p_Var5[0x43]._M_prev) &&
                             (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x43]._M_prev))) {
                            fVar2 = (paVar16->mOffsetMatrix).b4;
                            pfVar1 = (float *)((long)&p_Var5[0x43]._M_prev + 4);
                            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                              fVar2 = (paVar16->mOffsetMatrix).c1;
                              if ((fVar2 == *(float *)&p_Var5[0x44]._M_next) &&
                                 (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x44]._M_next))) {
                                fVar2 = (paVar16->mOffsetMatrix).c2;
                                pfVar1 = (float *)((long)&p_Var5[0x44]._M_next + 4);
                                if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                  fVar2 = (paVar16->mOffsetMatrix).c3;
                                  if ((fVar2 == *(float *)&p_Var5[0x44]._M_prev) &&
                                     (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x44]._M_prev))) {
                                    fVar2 = (paVar16->mOffsetMatrix).c4;
                                    pfVar1 = (float *)((long)&p_Var5[0x44]._M_prev + 4);
                                    if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                      fVar2 = (paVar16->mOffsetMatrix).d1;
                                      if ((fVar2 == *(float *)&p_Var5[0x45]._M_next) &&
                                         (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x45]._M_next))) {
                                        fVar2 = (paVar16->mOffsetMatrix).d2;
                                        pfVar1 = (float *)((long)&p_Var5[0x45]._M_next + 4);
                                        if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))) {
                                          fVar2 = (paVar16->mOffsetMatrix).d3;
                                          if ((fVar2 == *(float *)&p_Var5[0x45]._M_prev) &&
                                             (!NAN(fVar2) && !NAN(*(float *)&p_Var5[0x45]._M_prev)))
                                          {
                                            fVar2 = (paVar16->mOffsetMatrix).d4;
                                            pfVar1 = (float *)((long)&p_Var5[0x45]._M_prev + 4);
                                            if ((fVar2 == *pfVar1) && (!NAN(fVar2) && !NAN(*pfVar1))
                                               ) goto LAB_003cf3b3;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
              this = DefaultLogger::get();
              Logger::warn(this,
                           "Bones with equal names but different offset matrices can\'t be joined at the moment"
                          );
            }
            p_Var19 = p_Var19 + 1;
          } while (p_Var19 != p_Var4);
        }
        uVar3 = paVar16->mNumWeights;
        uVar18 = (ulong)uVar3 * 8;
        __s = (aiVertexWeight *)operator_new__(uVar18);
        if ((ulong)uVar3 != 0) {
          memset(__s,0,uVar18);
        }
        paVar16->mWeights = __s;
        for (p_Var19 = p_Var20[2]._M_next; (p_Var19 != p_Var4 && (p_Var19 != p_Var20[2]._M_prev));
            p_Var19 = p_Var19 + 1) {
          p_Var5 = p_Var19->_M_next;
          paVar17 = __s;
          if (*(int *)((long)&p_Var5[0x40]._M_next + 4) != 0) {
            uVar18 = 0;
            do {
              p_Var6 = p_Var5[0x41]._M_prev;
              __s[uVar18].mWeight = *(float *)((long)&p_Var6->_M_next + uVar18 * 8 + 4);
              __s[uVar18].mVertexId =
                   *(int *)&p_Var19->_M_prev + *(int *)(&p_Var6->_M_next + uVar18);
              uVar18 = uVar18 + 1;
              paVar17 = paVar17 + 1;
            } while (uVar18 < *(uint *)((long)&p_Var5[0x40]._M_next + 4));
          }
          __s = paVar17;
        }
        pp_Var13 = &p_Var20->_M_next;
        p_Var20 = *pp_Var13;
        paVar14 = local_440;
      } while (*pp_Var13 != (_List_node_base *)&local_458);
    }
    std::__cxx11::_List_base<Assimp::BoneWithHash,_std::allocator<Assimp::BoneWithHash>_>::_M_clear
              (&local_458);
  }
  return;
}

Assistant:

void SceneCombiner::MergeBones(aiMesh* out,std::vector<aiMesh*>::const_iterator it,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == out || out->mNumBones == 0 ) {
        return;
    }

    // find we need to build an unique list of all bones.
    // we work with hashes to make the comparisons MUCH faster,
    // at least if we have many bones.
    std::list<BoneWithHash> asBones;
    BuildUniqueBoneList( asBones, it, end );

    // now create the output bones
    out->mNumBones = 0;
    out->mBones = new aiBone*[asBones.size()];

    for (std::list<BoneWithHash>::const_iterator boneIt = asBones.begin(),boneEnd = asBones.end(); boneIt != boneEnd; ++boneIt )  {
        // Allocate a bone and setup it's name
        aiBone* pc = out->mBones[out->mNumBones++] = new aiBone();
        pc->mName = aiString( *( boneIt->second ));

        std::vector< BoneSrcIndex >::const_iterator wend = boneIt->pSrcBones.end();

        // Loop through all bones to be joined for this bone
        for (std::vector< BoneSrcIndex >::const_iterator wmit = boneIt->pSrcBones.begin(); wmit != wend; ++wmit)  {
            pc->mNumWeights += (*wmit).first->mNumWeights;

            // NOTE: different offset matrices for bones with equal names
            // are - at the moment - not handled correctly.
            if (wmit != boneIt->pSrcBones.begin() && pc->mOffsetMatrix != wmit->first->mOffsetMatrix) {
                ASSIMP_LOG_WARN("Bones with equal names but different offset matrices can't be joined at the moment");
                continue;
            }
            pc->mOffsetMatrix = wmit->first->mOffsetMatrix;
        }

        // Allocate the vertex weight array
        aiVertexWeight* avw = pc->mWeights = new aiVertexWeight[pc->mNumWeights];

        // And copy the final weights - adjust the vertex IDs by the
        // face index offset of the corresponding mesh.
        for (std::vector< BoneSrcIndex >::const_iterator wmit = (*boneIt).pSrcBones.begin(); wmit != (*boneIt).pSrcBones.end(); ++wmit) {
            if (wmit == wend) {
                break;
            }

            aiBone* pip = (*wmit).first;
            for (unsigned int mp = 0; mp < pip->mNumWeights;++mp,++avw) {
                const aiVertexWeight& vfi = pip->mWeights[mp];
                avw->mWeight = vfi.mWeight;
                avw->mVertexId = vfi.mVertexId + (*wmit).second;
            }
        }
    }
}